

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O2

void __thiscall EquationAnd::~EquationAnd(EquationAnd *this)

{
  ~EquationAnd(this);
  operator_delete(this);
  return;
}

Assistant:

EquationAnd::~EquationAnd(void)

{
  PatternEquation::release(left);
  PatternEquation::release(right);
}